

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_libpd.c
# Opt level: O0

int libpd_pitchbend(int channel,int value)

{
  int value_local;
  int channel_local;
  
  if (channel < 0) {
    value_local = -1;
  }
  else if ((value < -0x2000) || (0x1fff < value)) {
    value_local = -1;
  }
  else {
    sys_lock();
    inmidi_pitchbend(channel >> 4,channel & 0xf,value + 0x2000);
    sys_unlock();
    value_local = 0;
  }
  return value_local;
}

Assistant:

int libpd_pitchbend(int channel, int value) {
  CHECK_CHANNEL
  if (value < -8192 || value > 8191) return -1;
  sys_lock();
  inmidi_pitchbend(PORT, CHANNEL, value + 8192);
  sys_unlock();
  return 0;
}